

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O3

void __thiscall xcardMT::xcardMT(xcardMT *this,string *prefix,int threads,int debug)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-1","");
  xcard::xcard(&this->super_xcard,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->max_threads = -1;
  std::__cxx11::string::_M_assign((string *)this);
  (this->super_xcard).debug = debug;
  if (0 < threads) {
    this->max_threads = threads;
  }
  return;
}

Assistant:

xcardMT::xcardMT(std::string prefix, int threads, int debug)
{

    this->prefix = prefix;
    this->debug = debug;
    
    if (threads > 0){
    this->max_threads = threads;
    }
}